

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O0

uuid __thiscall
uuids::basic_uuid_random_generator<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>_>
::operator()(basic_uuid_random_generator<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>_>
             *this)

{
  result_type rVar1;
  element_type *__urng;
  uchar *first;
  uchar *last;
  int local_34;
  result_type local_30;
  int i;
  uint8_t bytes [16];
  basic_uuid_random_generator<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>_>
  *this_local;
  
  bytes._8_8_ = this;
  for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 4) {
    __urng = std::
             __shared_ptr_access<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->generator);
    rVar1 = std::uniform_int_distribution<unsigned_int>::operator()(&this->distribution,__urng);
    *(result_type *)((long)&local_30 + (long)local_34) = rVar1;
  }
  bytes[0] = bytes[0] & 0xbf | 0x80;
  i._2_1_ = i._2_1_ & 0x4f | 0x40;
  first = std::begin<unsigned_char,16ul>((uchar (*) [16])&local_30);
  last = std::end<unsigned_char,16ul>((uchar (*) [16])&local_30);
  uuid::uuid<unsigned_char*>((uuid *)&this_local,first,last);
  return (array<unsigned_char,_16UL>)(array<unsigned_char,_16UL>)_this_local;
}

Assistant:

[[nodiscard]] uuid operator()()
      {
         alignas(uint32_t) uint8_t bytes[16];
         for (int i = 0; i < 16; i += 4)
            *reinterpret_cast<uint32_t*>(bytes + i) = distribution(*generator);

         // variant must be 10xxxxxx
         bytes[8] &= 0xBF;
         bytes[8] |= 0x80;

         // version must be 0100xxxx
         bytes[6] &= 0x4F;
         bytes[6] |= 0x40;

         return uuid{std::begin(bytes), std::end(bytes)};
      }